

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O0

void __thiscall
TempTrackerBase::TempTrackerBase(TempTrackerBase *this,JitArenaAllocator *alloc,bool inLoop)

{
  HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *pHVar1;
  bool inLoop_local;
  JitArenaAllocator *alloc_local;
  TempTrackerBase *this_local;
  
  BVSparse<Memory::JitArenaAllocator>::BVSparse(&this->nonTempSyms,alloc);
  BVSparse<Memory::JitArenaAllocator>::BVSparse(&this->tempTransferredSyms,alloc);
  if (inLoop) {
    pHVar1 = HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator>::New
                       (&alloc->super_ArenaAllocator,0x10);
    this->tempTransferDependencies = pHVar1;
  }
  else {
    this->tempTransferDependencies =
         (HashTable<BVSparse<Memory::JitArenaAllocator>_*,_Memory::ArenaAllocator> *)0x0;
  }
  return;
}

Assistant:

TempTrackerBase::TempTrackerBase(JitArenaAllocator * alloc, bool inLoop)
    : nonTempSyms(alloc), tempTransferredSyms(alloc)
{
    if (inLoop)
    {
        tempTransferDependencies = HashTable<BVSparse<JitArenaAllocator> *>::New(alloc, 16);
    }
    else
    {
        tempTransferDependencies = nullptr;
    }
}